

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O1

void __thiscall Fl_Menu_Item_Type::write_static(Fl_Menu_Item_Type *this)

{
  Fl_Type *pFVar1;
  Fluid_Image *this_00;
  bool bVar2;
  bool bVar3;
  char c;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar9;
  char *pcVar10;
  Fl_Menu_Item_Type *m;
  Fl_Widget_Type *o;
  char *pcVar11;
  Fl_Type *pFVar12;
  Fl_Type *pFVar13;
  long lVar14;
  int i_2;
  int i_1;
  int i;
  uint local_44;
  int local_40;
  int local_3c;
  char *local_38;
  
  pcVar9 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
  if (((pcVar9 != (char *)0x0) && (iVar4 = is_name(pcVar9), iVar4 != 0)) &&
     (iVar4 = Fl_Type::user_defined
                        ((Fl_Type *)this,(this->super_Fl_Widget_Type).super_Fl_Type.callback_),
     iVar4 == 0)) {
    pcVar9 = (this->super_Fl_Widget_Type).super_Fl_Type.user_data_type_;
    pcVar6 = "void*";
    if (pcVar9 != (char *)0x0) {
      pcVar6 = pcVar9;
    }
    write_declare("extern void %s(Fl_Menu_*, %s);",
                  (this->super_Fl_Widget_Type).super_Fl_Type.callback_,pcVar6);
  }
  lVar14 = 0xf;
  do {
    pcVar9 = (this->super_Fl_Widget_Type).extra_code_[lVar14 + -0xf];
    if ((pcVar9 != (char *)0x0) && (iVar4 = isdeclare(pcVar9), iVar4 != 0)) {
      write_declare("%s",(this->super_Fl_Widget_Type).extra_code_[lVar14 + -0xf]);
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x13);
  pcVar9 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
  if ((pcVar9 != (char *)0x0) && (iVar4 = is_name(pcVar9), iVar4 == 0)) {
    pcVar9 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
    bVar3 = false;
    bVar2 = false;
LAB_0017e48c:
    if (*pcVar9 == 'o') {
      iVar4 = is_id(pcVar9[1]);
      if (iVar4 == 0) {
        bVar2 = true;
      }
    }
    else if (*pcVar9 == '\0') goto LAB_0017e4f1;
    if ((*pcVar9 == 'v') && (iVar4 = is_id(pcVar9[1]), iVar4 == 0)) {
      bVar3 = true;
    }
    do {
      pcVar6 = pcVar9 + 1;
      pcVar9 = pcVar9 + 1;
      iVar4 = is_id(*pcVar6);
    } while (iVar4 != 0);
    c = *pcVar9;
    while ((c != '\0' && (iVar4 = is_id(c), iVar4 == 0))) {
      c = pcVar9[1];
      pcVar9 = pcVar9 + 1;
    }
    goto LAB_0017e48c;
  }
  goto LAB_0017e6f7;
LAB_0017e4f1:
  pcVar6 = Fl_Type::callback_name((Fl_Type *)this);
  pcVar7 = Fl_Type::class_name((Fl_Type *)this,1);
  if (pcVar7 == (char *)0x0) {
    write_c("\nstatic void %s(Fl_Menu_*",pcVar6);
  }
  else {
    write_c("\nvoid %s::%s_i(Fl_Menu_*",pcVar7,pcVar6);
  }
  if (bVar2) {
    write_c(" o");
  }
  pcVar10 = (this->super_Fl_Widget_Type).super_Fl_Type.user_data_type_;
  pcVar11 = "void*";
  if (pcVar10 != (char *)0x0) {
    pcVar11 = pcVar10;
  }
  write_c(", %s",pcVar11);
  if (bVar3) {
    write_c(" v");
  }
  write_c(") {\n  %s",(this->super_Fl_Widget_Type).super_Fl_Type.callback_);
  if (pcVar9[-1] != ';') {
    pcVar9 = (this->super_Fl_Widget_Type).super_Fl_Type.callback_;
    pcVar8 = strrchr(pcVar9,10);
    pcVar10 = pcVar8 + 1;
    if (pcVar8 == (char *)0x0) {
      pcVar10 = pcVar9;
    }
    if ((*pcVar10 != '\0') && (*pcVar10 != '#')) {
      write_c(";");
    }
  }
  write_c("\n}\n");
  if (pcVar7 == (char *)0x0) goto LAB_0017e6f7;
  write_c("void %s::%s(Fl_Menu_* o, %s v) {\n",pcVar7,pcVar6,pcVar11);
  write_c("  ((%s*)(o",pcVar7);
  pFVar13 = (Fl_Type *)this;
  do {
    pFVar13 = pFVar13->parent;
    iVar4 = (*pFVar13->_vptr_Fl_Type[0x1e])(pFVar13);
  } while (iVar4 != 0);
  iVar4 = (*pFVar13->_vptr_Fl_Type[5])(pFVar13);
  iVar4 = strcmp((char *)CONCAT44(extraout_var,iVar4),"Fl_Input_Choice");
  if (iVar4 == 0) {
    write_c("->parent()");
  }
  pFVar13 = pFVar13->parent;
  if ((pFVar13 == (Fl_Type *)0x0) || (iVar4 = (*pFVar13->_vptr_Fl_Type[0x17])(pFVar13), iVar4 == 0))
  {
    pFVar12 = (Fl_Type *)0x0;
  }
  else {
    pFVar12 = (Fl_Type *)0x0;
    while (iVar4 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x26])(this),
          iVar4 == 0) {
      write_c("->parent()");
      pFVar1 = pFVar13->parent;
      pFVar12 = pFVar13;
      if ((pFVar1 == (Fl_Type *)0x0) ||
         (iVar4 = (*pFVar1->_vptr_Fl_Type[0x17])(pFVar1), pFVar13 = pFVar1, iVar4 == 0)) break;
    }
  }
  if (pFVar12 == (Fl_Type *)0x0) {
LAB_0017e6d8:
    write_c("->user_data()");
  }
  else {
    iVar4 = (*pFVar12->_vptr_Fl_Type[5])(pFVar12);
    iVar4 = strcmp((char *)CONCAT44(extraout_var_00,iVar4),"widget_class");
    if (iVar4 != 0) goto LAB_0017e6d8;
  }
  write_c("))->%s_i(o,v);\n}\n",pcVar6);
LAB_0017e6f7:
  this_00 = (this->super_Fl_Widget_Type).image;
  if ((this_00 != (Fluid_Image *)0x0) && (this_00->written != write_number)) {
    Fluid_Image::write_static(this_00);
    ((this->super_Fl_Widget_Type).image)->written = write_number;
  }
  pFVar13 = (this->super_Fl_Widget_Type).super_Fl_Type.next;
  if ((pFVar13 == (Fl_Type *)0x0) || (iVar4 = (*pFVar13->_vptr_Fl_Type[0x1e])(), iVar4 == 0)) {
    pcVar9 = Fl_Type::class_name((Fl_Type *)this,1);
    if (pcVar9 == (char *)0x0) {
      if (i18n_type != 0) {
        pcVar6 = menu_name(this,&local_40);
        write_c("\nunsigned char %s_i18n_done = 0;",pcVar6);
      }
      pcVar6 = menu_name(this,&local_40);
      write_c("\nFl_Menu_Item %s[] = {\n",pcVar6);
    }
    else {
      if (i18n_type != 0) {
        pcVar6 = menu_name(this,&local_3c);
        write_c("\nunsigned char %s::%s_i18n_done = 0;",pcVar9,pcVar6);
      }
      pcVar6 = menu_name(this,&local_3c);
      write_c("\nFl_Menu_Item %s::%s[] = {\n",pcVar9,pcVar6);
    }
    pFVar13 = (this->super_Fl_Widget_Type).super_Fl_Type.prev;
    while ((pFVar13 != (Fl_Type *)0x0 &&
           (iVar4 = (*pFVar13->_vptr_Fl_Type[0x1e])(pFVar13), iVar4 != 0))) {
      pFVar13 = pFVar13->prev;
    }
    pFVar12 = pFVar13->next;
    local_38 = pcVar9;
    while ((pFVar12 != (Fl_Type *)0x0 &&
           (iVar4 = (*(((Fl_Widget_Type *)&pFVar12->_vptr_Fl_Type)->super_Fl_Type)._vptr_Fl_Type
                      [0x1e])(pFVar12), iVar4 != 0))) {
      write_item((Fl_Menu_Item_Type *)pFVar12);
      iVar4 = pFVar12->level;
      iVar5 = (*(((Fl_Widget_Type *)&pFVar12->_vptr_Fl_Type)->super_Fl_Type)._vptr_Fl_Type[0x16])
                        (pFVar12);
      iVar4 = (iVar4 + 1) - (uint)(iVar5 == 0);
      if ((pFVar12->next == (Fl_Type *)0x0) ||
         (iVar5 = (*pFVar12->next->_vptr_Fl_Type[0x1e])(), iVar5 == 0)) {
        iVar5 = pFVar13->level + 1;
      }
      else {
        iVar5 = pFVar12->next->level;
      }
      for (; iVar5 < iVar4; iVar4 = iVar4 + -1) {
        write_c(" {0,0,0,0,0,0,0,0,0},\n");
      }
      pFVar12 = pFVar12->next;
    }
    write_c(" {0,0,0,0,0,0,0,0,0}\n};\n");
    pcVar9 = local_38;
    if (local_38 != (char *)0x0) {
      do {
        this = (Fl_Menu_Item_Type *)((Fl_Type *)this)->prev;
        if ((Fl_Type *)this == (Fl_Type *)0x0) break;
        iVar4 = (*((Fl_Type *)this)->_vptr_Fl_Type[0x1e])(this);
      } while (iVar4 != 0);
      o = (Fl_Widget_Type *)((Fl_Type *)this)->next;
      if (o != (Fl_Widget_Type *)0x0) {
        do {
          iVar4 = (*(o->super_Fl_Type)._vptr_Fl_Type[0x1e])(o);
          if (iVar4 == 0) {
            return;
          }
          pcVar6 = array_name(o);
          if (pcVar6 != (char *)0x0) {
            if (pcVar6 == (o->super_Fl_Type).name_) {
              pcVar7 = menu_name((Fl_Menu_Item_Type *)o,(int *)&local_44);
              write_c("Fl_Menu_Item* %s::%s = %s::%s + %d;\n",pcVar9,pcVar6,pcVar9,pcVar7,
                      (ulong)local_44);
            }
            else {
              write_c("Fl_Menu_Item* %s::%s;\n",pcVar9,pcVar6);
            }
          }
          o = (Fl_Widget_Type *)(o->super_Fl_Type).next;
        } while (o != (Fl_Widget_Type *)0x0);
      }
    }
  }
  return;
}

Assistant:

void Fl_Menu_Item_Type::write_static() {
  if (callback() && is_name(callback()) && !user_defined(callback()))
    write_declare("extern void %s(Fl_Menu_*, %s);", callback(),
                  user_data_type() ? user_data_type() : "void*");
  for (int n=0; n < NUM_EXTRA_CODE; n++) {
    if (extra_code(n) && isdeclare(extra_code(n)))
      write_declare("%s", extra_code(n));
  }
  if (callback() && !is_name(callback())) {
    // see if 'o' or 'v' used, to prevent unused argument warnings:
    int use_o = 0;
    int use_v = 0;
    const char *d;
    for (d = callback(); *d;) {
      if (*d == 'o' && !is_id(d[1])) use_o = 1;
      if (*d == 'v' && !is_id(d[1])) use_v = 1;
      do d++; while (is_id(*d));
      while (*d && !is_id(*d)) d++;
    }
    const char* cn = callback_name();
    const char* k = class_name(1);
    if (k) {
      write_c("\nvoid %s::%s_i(Fl_Menu_*", k, cn);
    } else {
      write_c("\nstatic void %s(Fl_Menu_*", cn);
    }
    if (use_o) write_c(" o");
    const char* ut = user_data_type() ? user_data_type() : "void*";
    write_c(", %s", ut);
    if (use_v) write_c(" v");
    write_c(") {\n  %s", callback());
    if (*(d-1) != ';') {
      const char *p = strrchr(callback(), '\n');
      if (p) p ++;
      else p = callback();
      // Only add trailing semicolon if the last line is not a preprocessor
      // statement...
      if (*p != '#' && *p) write_c(";");
    }
    write_c("\n}\n");
    if (k) {
      write_c("void %s::%s(Fl_Menu_* o, %s v) {\n", k, cn, ut);
      write_c("  ((%s*)(o", k);
      Fl_Type* t = parent; while (t->is_menu_item()) t = t->parent;
      Fl_Type *q = 0;
      // Go up one more level for Fl_Input_Choice, as these are groups themselves
      if (t && !strcmp(t->type_name(), "Fl_Input_Choice"))
        write_c("->parent()");
      for (t = t->parent; t && t->is_widget() && !is_class(); q = t, t = t->parent) 
        write_c("->parent()");
      if (!q || strcmp(q->type_name(), "widget_class"))
        write_c("->user_data()");
      write_c("))->%s_i(o,v);\n}\n", cn);
    }
  }
  if (image) {
    if (image->written != write_number) {
      image->write_static();
      image->written = write_number;
    }
  }
  if (next && next->is_menu_item()) return;
  // okay, when we hit last item in the menu we have to write the
  // entire array out:
  const char* k = class_name(1);
  if (k) {
    int i; 
    if (i18n_type) write_c("\nunsigned char %s::%s_i18n_done = 0;", k, menu_name(i));
    write_c("\nFl_Menu_Item %s::%s[] = {\n", k, menu_name(i));
  } else {
    int i; 
    if (i18n_type) write_c("\nunsigned char %s_i18n_done = 0;", menu_name(i));
    write_c("\nFl_Menu_Item %s[] = {\n", menu_name(i));
  }
  Fl_Type* t = prev; while (t && t->is_menu_item()) t = t->prev;
  for (Fl_Type* q = t->next; q && q->is_menu_item(); q = q->next) {
    ((Fl_Menu_Item_Type*)q)->write_item();
    int thislevel = q->level; if (q->is_parent()) thislevel++;
    int nextlevel =
      (q->next && q->next->is_menu_item()) ? q->next->level : t->level+1;
    while (thislevel > nextlevel) {write_c(" {0,0,0,0,0,0,0,0,0},\n"); thislevel--;}
  }
  write_c(" {0,0,0,0,0,0,0,0,0}\n};\n");

  if (k) {
    // Write menu item variables...
    t = prev; while (t && t->is_menu_item()) t = t->prev;
    for (Fl_Type* q = t->next; q && q->is_menu_item(); q = q->next) {
      Fl_Menu_Item_Type *m = (Fl_Menu_Item_Type*)q;
      const char *c = array_name(m);
      if (c) {
        if (c==m->name()) {
          // assign a menu item address directly to a variable
          int i; 
          const char* n = ((Fl_Menu_Item_Type *)q)->menu_name(i);
          write_c("Fl_Menu_Item* %s::%s = %s::%s + %d;\n", k, c, k, n, i);
        } else {
          // if the name is an array, only define the array. 
          // The actual assignment is in write_code1()
          write_c("Fl_Menu_Item* %s::%s;\n", k, c);
        }
      }
    }
  }
}